

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::LogisticSigmoid::forward_impl
          (LogisticSigmoid *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx)

{
  pointer ppTVar1;
  Tensor *pTVar2;
  float *pfVar3;
  float *pfVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  Index index_1;
  ulong uVar15;
  Index index;
  ushort uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  int iVar40;
  int iVar41;
  float fVar42;
  
  ppTVar1 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 != 8) {
    __assert_fail("xs.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes.cc"
                  ,0x821,
                  "virtual void cnn::LogisticSigmoid::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                 );
  }
  pTVar2 = *ppTVar1;
  uVar12 = (ulong)(pTVar2->d).nd;
  iVar41 = 1;
  iVar40 = 1;
  if (uVar12 != 0) {
    auVar19 = vpbroadcastq_avx512f();
    auVar20 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar13 = 0;
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar23 = vmovdqa64_avx512f(auVar20);
      auVar20 = vpbroadcastq_avx512f();
      auVar24 = vporq_avx512f(auVar20,auVar21);
      auVar20 = vporq_avx512f(auVar20,auVar22);
      uVar7 = vpcmpuq_avx512f(auVar20,auVar19,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar24,auVar19,2);
      bVar9 = (byte)uVar7;
      uVar16 = CONCAT11(bVar9,bVar8);
      auVar20 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar13));
      auVar24._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar20._4_4_;
      auVar24._0_4_ = (uint)(bVar8 & 1) * auVar20._0_4_;
      auVar24._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar20._8_4_;
      auVar24._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar20._12_4_;
      auVar24._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar20._16_4_;
      auVar24._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar20._20_4_;
      auVar24._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar20._24_4_;
      auVar24._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar20._28_4_;
      auVar24._32_4_ = (uint)(bVar9 & 1) * auVar20._32_4_;
      auVar24._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar20._36_4_;
      auVar24._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar20._40_4_;
      auVar24._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar20._44_4_;
      auVar24._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar20._48_4_;
      auVar24._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar20._52_4_;
      auVar24._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar20._56_4_;
      auVar24._60_4_ = (uint)(bVar9 >> 7) * auVar20._60_4_;
      auVar20 = vpmulld_avx512f(auVar24,auVar23);
      uVar13 = uVar13 + 0x10;
    } while ((uVar12 + 0xf & 0x1fffffff0) != uVar13);
    auVar19 = vmovdqa32_avx512f(auVar20);
    auVar20._0_4_ = (uint)(bVar8 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar23._0_4_;
    bVar5 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar20._4_4_ = (uint)bVar5 * auVar19._4_4_ | (uint)!bVar5 * auVar23._4_4_;
    bVar5 = (bool)((byte)(uVar16 >> 2) & 1);
    auVar20._8_4_ = (uint)bVar5 * auVar19._8_4_ | (uint)!bVar5 * auVar23._8_4_;
    bVar5 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar20._12_4_ = (uint)bVar5 * auVar19._12_4_ | (uint)!bVar5 * auVar23._12_4_;
    bVar5 = (bool)((byte)(uVar16 >> 4) & 1);
    auVar20._16_4_ = (uint)bVar5 * auVar19._16_4_ | (uint)!bVar5 * auVar23._16_4_;
    bVar5 = (bool)((byte)(uVar16 >> 5) & 1);
    auVar20._20_4_ = (uint)bVar5 * auVar19._20_4_ | (uint)!bVar5 * auVar23._20_4_;
    bVar5 = (bool)((byte)(uVar16 >> 6) & 1);
    auVar20._24_4_ = (uint)bVar5 * auVar19._24_4_ | (uint)!bVar5 * auVar23._24_4_;
    bVar5 = (bool)((byte)(uVar16 >> 7) & 1);
    auVar20._28_4_ = (uint)bVar5 * auVar19._28_4_ | (uint)!bVar5 * auVar23._28_4_;
    auVar20._32_4_ = (uint)(bVar9 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar23._32_4_;
    bVar5 = (bool)(bVar9 >> 1 & 1);
    auVar20._36_4_ = (uint)bVar5 * auVar19._36_4_ | (uint)!bVar5 * auVar23._36_4_;
    bVar5 = (bool)(bVar9 >> 2 & 1);
    auVar20._40_4_ = (uint)bVar5 * auVar19._40_4_ | (uint)!bVar5 * auVar23._40_4_;
    bVar5 = (bool)(bVar9 >> 3 & 1);
    auVar20._44_4_ = (uint)bVar5 * auVar19._44_4_ | (uint)!bVar5 * auVar23._44_4_;
    bVar5 = (bool)(bVar9 >> 4 & 1);
    auVar20._48_4_ = (uint)bVar5 * auVar19._48_4_ | (uint)!bVar5 * auVar23._48_4_;
    bVar5 = (bool)(bVar9 >> 5 & 1);
    auVar20._52_4_ = (uint)bVar5 * auVar19._52_4_ | (uint)!bVar5 * auVar23._52_4_;
    bVar5 = (bool)(bVar9 >> 6 & 1);
    auVar20._56_4_ = (uint)bVar5 * auVar19._56_4_ | (uint)!bVar5 * auVar23._56_4_;
    auVar20._60_4_ =
         (uint)(bVar9 >> 7) * auVar19._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar23._60_4_;
    auVar18 = vextracti64x4_avx512f(auVar20,1);
    auVar19 = vpmulld_avx512f(auVar20,ZEXT3264(auVar18));
    auVar17 = vpmulld_avx(auVar19._0_16_,auVar19._16_16_);
    auVar6 = vpshufd_avx(auVar17,0xee);
    auVar17 = vpmulld_avx(auVar17,auVar6);
    auVar6 = vpshufd_avx(auVar17,0x55);
    auVar17 = vpmulld_avx(auVar17,auVar6);
    iVar40 = auVar17._0_4_;
  }
  uVar12 = (ulong)(fx->d).nd;
  if (uVar12 != 0) {
    auVar19 = vpbroadcastq_avx512f();
    auVar20 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar13 = 0;
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar23 = vmovdqa64_avx512f(auVar20);
      auVar20 = vpbroadcastq_avx512f();
      auVar24 = vporq_avx512f(auVar20,auVar21);
      auVar20 = vporq_avx512f(auVar20,auVar22);
      uVar7 = vpcmpuq_avx512f(auVar20,auVar19,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar24,auVar19,2);
      bVar9 = (byte)uVar7;
      uVar16 = CONCAT11(bVar9,bVar8);
      auVar20 = vmovdqu32_avx512f(*(undefined1 (*) [64])((fx->d).d + uVar13));
      auVar25._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar20._4_4_;
      auVar25._0_4_ = (uint)(bVar8 & 1) * auVar20._0_4_;
      auVar25._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar20._8_4_;
      auVar25._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar20._12_4_;
      auVar25._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar20._16_4_;
      auVar25._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar20._20_4_;
      auVar25._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar20._24_4_;
      auVar25._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar20._28_4_;
      auVar25._32_4_ = (uint)(bVar9 & 1) * auVar20._32_4_;
      auVar25._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar20._36_4_;
      auVar25._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar20._40_4_;
      auVar25._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar20._44_4_;
      auVar25._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar20._48_4_;
      auVar25._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar20._52_4_;
      auVar25._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar20._56_4_;
      auVar25._60_4_ = (uint)(bVar9 >> 7) * auVar20._60_4_;
      auVar20 = vpmulld_avx512f(auVar25,auVar23);
      uVar13 = uVar13 + 0x10;
    } while ((uVar12 + 0xf & 0x1fffffff0) != uVar13);
    auVar19 = vmovdqa32_avx512f(auVar20);
    auVar21._0_4_ = (uint)(bVar8 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar23._0_4_;
    bVar5 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar21._4_4_ = (uint)bVar5 * auVar19._4_4_ | (uint)!bVar5 * auVar23._4_4_;
    bVar5 = (bool)((byte)(uVar16 >> 2) & 1);
    auVar21._8_4_ = (uint)bVar5 * auVar19._8_4_ | (uint)!bVar5 * auVar23._8_4_;
    bVar5 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar21._12_4_ = (uint)bVar5 * auVar19._12_4_ | (uint)!bVar5 * auVar23._12_4_;
    bVar5 = (bool)((byte)(uVar16 >> 4) & 1);
    auVar21._16_4_ = (uint)bVar5 * auVar19._16_4_ | (uint)!bVar5 * auVar23._16_4_;
    bVar5 = (bool)((byte)(uVar16 >> 5) & 1);
    auVar21._20_4_ = (uint)bVar5 * auVar19._20_4_ | (uint)!bVar5 * auVar23._20_4_;
    bVar5 = (bool)((byte)(uVar16 >> 6) & 1);
    auVar21._24_4_ = (uint)bVar5 * auVar19._24_4_ | (uint)!bVar5 * auVar23._24_4_;
    bVar5 = (bool)((byte)(uVar16 >> 7) & 1);
    auVar21._28_4_ = (uint)bVar5 * auVar19._28_4_ | (uint)!bVar5 * auVar23._28_4_;
    auVar21._32_4_ = (uint)(bVar9 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar23._32_4_;
    bVar5 = (bool)(bVar9 >> 1 & 1);
    auVar21._36_4_ = (uint)bVar5 * auVar19._36_4_ | (uint)!bVar5 * auVar23._36_4_;
    bVar5 = (bool)(bVar9 >> 2 & 1);
    auVar21._40_4_ = (uint)bVar5 * auVar19._40_4_ | (uint)!bVar5 * auVar23._40_4_;
    bVar5 = (bool)(bVar9 >> 3 & 1);
    auVar21._44_4_ = (uint)bVar5 * auVar19._44_4_ | (uint)!bVar5 * auVar23._44_4_;
    bVar5 = (bool)(bVar9 >> 4 & 1);
    auVar21._48_4_ = (uint)bVar5 * auVar19._48_4_ | (uint)!bVar5 * auVar23._48_4_;
    bVar5 = (bool)(bVar9 >> 5 & 1);
    auVar21._52_4_ = (uint)bVar5 * auVar19._52_4_ | (uint)!bVar5 * auVar23._52_4_;
    bVar5 = (bool)(bVar9 >> 6 & 1);
    auVar21._56_4_ = (uint)bVar5 * auVar19._56_4_ | (uint)!bVar5 * auVar23._56_4_;
    auVar21._60_4_ =
         (uint)(bVar9 >> 7) * auVar19._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar23._60_4_;
    auVar18 = vextracti64x4_avx512f(auVar21,1);
    auVar19 = vpmulld_avx512f(auVar21,ZEXT3264(auVar18));
    auVar17 = vpmulld_avx(auVar19._0_16_,auVar19._16_16_);
    auVar6 = vpshufd_avx(auVar17,0xee);
    auVar17 = vpmulld_avx(auVar17,auVar6);
    auVar6 = vpshufd_avx(auVar17,0x55);
    auVar17 = vpmulld_avx(auVar17,auVar6);
    iVar41 = auVar17._0_4_;
  }
  uVar14 = iVar41 * (fx->d).bd;
  uVar12 = (ulong)uVar14;
  if (uVar14 != iVar40 * (pTVar2->d).bd) {
    __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                  "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                 );
  }
  pfVar3 = fx->v;
  uVar13 = uVar12;
  if ((((ulong)pfVar3 & 3) == 0) &&
     (uVar13 = (ulong)(-((uint)((ulong)pfVar3 >> 2) & 0x3fffffff) & 0xf), uVar12 <= uVar13)) {
    uVar13 = uVar12;
  }
  pfVar4 = pTVar2->v;
  uVar11 = uVar12 - uVar13;
  uVar15 = uVar11 + 0xf;
  if (-1 < (long)uVar11) {
    uVar15 = uVar11;
  }
  if (uVar13 != 0) {
    uVar10 = 0;
    do {
      auVar17._8_4_ = 0x80000000;
      auVar17._0_8_ = 0x8000000080000000;
      auVar17._12_4_ = 0x80000000;
      auVar17 = vxorps_avx512vl(ZEXT416((uint)pfVar4[uVar10]),auVar17);
      fVar42 = expf(auVar17._0_4_);
      pfVar3[uVar10] = 1.0 / (fVar42 + 1.0);
      uVar10 = uVar10 + 1;
    } while (uVar13 != uVar10);
  }
  uVar15 = (uVar15 & 0xfffffffffffffff0) + uVar13;
  if (0xf < (long)uVar11) {
    auVar19 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    auVar20 = vbroadcastss_avx512f(ZEXT416(0x42b0c0a6));
    auVar21 = vbroadcastss_avx512f(ZEXT416(0xc2b0c0a5));
    auVar22 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
    auVar23 = vbroadcastss_avx512f(ZEXT416(0x3fb8aa3b));
    auVar24 = vbroadcastss_avx512f(ZEXT416(0xbf317218));
    auVar25 = vbroadcastss_avx512f(ZEXT416(0x39506967));
    auVar26 = vbroadcastss_avx512f(ZEXT416(0x3ab743ce));
    auVar27 = vbroadcastss_avx512f(ZEXT416(0x3d2aa9c1));
    auVar28 = vbroadcastss_avx512f(ZEXT416(0x3e2aaaaa));
    auVar29 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar30 = vbroadcastss_avx512f(ZEXT416(0x3c088908));
    auVar31 = vbroadcastss_avx512f(ZEXT416(0x42fe0000));
    do {
      auVar32 = vxorps_avx512dq(auVar19,*(undefined1 (*) [64])(pfVar4 + uVar13));
      auVar33 = vminps_avx512f(auVar32,auVar20);
      auVar33 = vmaxps_avx512f(auVar33,auVar21);
      auVar34 = vfmadd231ps_avx512f(auVar22,auVar33,auVar23);
      auVar34 = vrndscaleps_avx512f(auVar34,1);
      auVar33 = vfmadd231ps_avx512f(auVar33,auVar34,auVar24);
      auVar35 = vmulps_avx512f(auVar33,auVar33);
      auVar36 = vmulps_avx512f(auVar35,auVar33);
      auVar37 = vfmadd213ps_avx512f(auVar25,auVar33,auVar26);
      auVar38 = vfmadd213ps_avx512f(auVar27,auVar33,auVar28);
      auVar39 = vaddps_avx512f(auVar33,auVar29);
      auVar37 = vfmadd213ps_avx512f(auVar37,auVar33,auVar30);
      auVar33 = vfmadd213ps_avx512f(auVar38,auVar33,auVar22);
      auVar33 = vfmadd231ps_avx512f(auVar33,auVar36,auVar37);
      auVar33 = vfmadd213ps_avx512f(auVar33,auVar35,auVar39);
      auVar34 = vaddps_avx512f(auVar34,auVar31);
      auVar34 = vcvttps2dq_avx512f(auVar34);
      auVar34 = vpslld_avx512f(auVar34,0x17);
      auVar33 = vmulps_avx512f(auVar33,auVar34);
      auVar32 = vmaxps_avx512f(auVar32,auVar33);
      auVar32 = vaddps_avx512f(auVar32,auVar29);
      auVar33 = vrcp14ps_avx512f(auVar32);
      auVar32 = vfmsub213ps_avx512f(auVar32,auVar33,auVar29);
      auVar32 = vfnmadd132ps_avx512vl(auVar32,auVar33,auVar33);
      *(undefined1 (*) [64])(pfVar3 + uVar13) = auVar32;
      uVar13 = uVar13 + 0x10;
    } while ((long)uVar13 < (long)uVar15);
  }
  if ((long)uVar15 < (long)uVar12) {
    do {
      auVar6._8_4_ = 0x80000000;
      auVar6._0_8_ = 0x8000000080000000;
      auVar6._12_4_ = 0x80000000;
      auVar17 = vxorps_avx512vl(ZEXT416((uint)pfVar4[uVar15]),auVar6);
      fVar42 = expf(auVar17._0_4_);
      pfVar3[uVar15] = 1.0 / (fVar42 + 1.0);
      uVar15 = uVar15 + 1;
    } while (uVar12 != uVar15);
  }
  return;
}

Assistant:

void SumBatches::backward_impl(const vector<const Tensor*>& xs,
                     const Tensor& fx,
                     const Tensor& dEdf,
                     unsigned i,
                     Tensor& dEdxi) const {
  assert(i == 0);
#if HAVE_CUDA
  for (unsigned i = 0; i < dEdxi.d.bd; ++i)
    CUBLAS_CHECK(cublasSaxpy(cublas_handle, fx.d.size(), kSCALAR_ONE, dEdf.v, 1, dEdxi.v + i * dEdxi.d.batch_size(), 1));
#else
  for (unsigned i = 0; i < dEdxi.d.bd; ++i)
    dEdxi.batch_matrix(i) += *dEdf;
#endif
}